

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImgDisplay * __thiscall cimg_library::CImgDisplay::show(CImgDisplay *this)

{
  CImgDisplay *pCVar1;
  
  if (((this->_width != 0) && (this->_height != 0)) && (this->_is_closed == true)) {
    if (cimg::Mutex_attr()::val == '\0') {
      show();
    }
    pthread_mutex_lock((pthread_mutex_t *)(cimg::Mutex_attr()::val + 600));
    this->_is_closed = false;
    if (this->_is_fullscreen == true) {
      _init_fullscreen(this);
    }
    _map_window(this);
    if (cimg::Mutex_attr()::val == '\0') {
      show();
    }
    pthread_mutex_unlock((pthread_mutex_t *)(cimg::Mutex_attr()::val + 600));
    pCVar1 = paint(this,true);
    return pCVar1;
  }
  return this;
}

Assistant:

CImgDisplay& show() {
      if (is_empty() || !_is_closed) return *this;
      cimg_lock_display();
      _is_closed = false;
      if (_is_fullscreen) _init_fullscreen();
      _map_window();
      cimg_unlock_display();
      return paint();
    }